

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeIntegerType(Builder *this,int width,bool hasSign)

{
  key_type kVar1;
  uint uVar2;
  Id IVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *this_00;
  mapped_type_conflict *pmVar7;
  Id local_48;
  Id local_44;
  unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> local_40 [4];
  Id debugResultId;
  key_type local_38 [4];
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  bool hasSign_local;
  Builder *pBStack_18;
  int width_local;
  Builder *this_local;
  
  local_38[3] = 0;
  type._3_1_ = hasSign;
  type._4_4_ = width;
  pBStack_18 = this;
  while( true ) {
    kVar1 = local_38[3];
    local_38[2] = 0x15;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar3 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar3,0,OpTypeInt);
      pIStack_28 = this_00;
      spv::Instruction::reserveOperands(this_00,2);
      spv::Instruction::addImmediateOperand(pIStack_28,type._4_4_);
      spv::Instruction::addImmediateOperand(pIStack_28,type._3_1_ & 1);
      local_38[0] = 0x15;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_38);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>(local_40,pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)local_40);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)local_40);
      Module::mapInstruction(&this->module,pIStack_28);
      if (((type._4_4_ != 8) && (type._4_4_ != 0x10)) && (type._4_4_ == 0x40)) {
        addCapability(this,CapabilityInt64);
      }
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        IVar3 = makeIntegerDebugType(this,type._4_4_,(bool)(type._3_1_ & 1));
        local_44 = IVar3;
        local_48 = spv::Instruction::getResultId(pIStack_28);
        pmVar7 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_48);
        *pmVar7 = IVar3;
      }
      IVar3 = spv::Instruction::getResultId(pIStack_28);
      return IVar3;
    }
    local_38[1] = 0x15;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_38[3]);
    pIStack_28 = *ppIVar6;
    uVar2 = spv::Instruction::getImmediateOperand(pIStack_28,0);
    if ((uVar2 == type._4_4_) &&
       (uVar2 = spv::Instruction::getImmediateOperand(pIStack_28,1),
       uVar2 == ((type._3_1_ & 1) != 0))) break;
    local_38[3] = local_38[3] + 1;
  }
  IVar3 = spv::Instruction::getResultId(pIStack_28);
  return IVar3;
}

Assistant:

Id Builder::makeIntegerType(int width, bool hasSign)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeInt].size(); ++t) {
        type = groupedTypes[OpTypeInt][t];
        if (type->getImmediateOperand(0) == (unsigned)width &&
            type->getImmediateOperand(1) == (hasSign ? 1u : 0u))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeInt);
    type->reserveOperands(2);
    type->addImmediateOperand(width);
    type->addImmediateOperand(hasSign ? 1 : 0);
    groupedTypes[OpTypeInt].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // deal with capabilities
    switch (width) {
    case 8:
    case 16:
        // these are currently handled by storage-type declarations and post processing
        break;
    case 64:
        addCapability(CapabilityInt64);
        break;
    default:
        break;
    }

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeIntegerDebugType(width, hasSign);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}